

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawList::PopClipRect(ImDrawList *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  long lVar4;
  ImVec4 *pIVar5;
  
  ImVector<ImVec4>::pop_back(&this->_ClipRectStack);
  lVar4 = (long)(this->_ClipRectStack).Size;
  pIVar5 = (this->_ClipRectStack).Data + lVar4 + -1;
  if (lVar4 == 0) {
    pIVar5 = &this->_Data->ClipRectFullscreen;
  }
  fVar1 = pIVar5->y;
  fVar2 = pIVar5->z;
  fVar3 = pIVar5->w;
  (this->_CmdHeader).ClipRect.x = pIVar5->x;
  (this->_CmdHeader).ClipRect.y = fVar1;
  (this->_CmdHeader).ClipRect.z = fVar2;
  (this->_CmdHeader).ClipRect.w = fVar3;
  _OnChangedClipRect(this);
  return;
}

Assistant:

void ImDrawList::PopClipRect()
{
    _ClipRectStack.pop_back();
    _CmdHeader.ClipRect = (_ClipRectStack.Size == 0) ? _Data->ClipRectFullscreen : _ClipRectStack.Data[_ClipRectStack.Size - 1];
    _OnChangedClipRect();
}